

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  string field_name;
  allocator local_62;
  allocator local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_60,"[",(allocator *)&local_40);
  bVar1 = TryConsume(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    bVar1 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar1) {
      return false;
    }
    std::__cxx11::string::string((string *)&local_60,"]",(allocator *)&local_40);
    bVar1 = ConsumeBeforeWhitespace(this,&local_60);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    bVar1 = ConsumeIdentifierBeforeWhitespace(this,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1 == false) {
    return false;
  }
  std::__cxx11::string::string((string *)&local_60,"Unknown/Reserved",(allocator *)&local_40);
  TryConsumeWhitespace(this,&local_60,"n/a");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,":",(allocator *)&local_40);
  bVar1 = TryConsumeBeforeWhitespace(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_60,"Unknown/Reserved",(allocator *)&local_40);
    TryConsumeWhitespace(this,&local_60,"n/a");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string((string *)&local_60,"{",&local_61);
    __lhs = &(this->tokenizer_).current_.text;
    _Var2 = std::operator==(__lhs,&local_60);
    if (_Var2) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,"<",&local_62);
      _Var2 = std::operator==(__lhs,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      if (!_Var2) {
        bVar1 = SkipFieldValue(this);
        goto LAB_003b2147;
      }
    }
  }
  bVar1 = SkipFieldMessage(this);
LAB_003b2147:
  if (bVar1 == false) {
    return false;
  }
  std::__cxx11::string::string((string *)&local_60,";",&local_61);
  bVar1 = TryConsume(this,&local_60);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,",",&local_62);
    TryConsume(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return true;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(ConsumeBeforeWhitespace("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
    }
    TryConsumeWhitespace("Unknown/Reserved", "n/a");

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsumeBeforeWhitespace(":")) {
      TryConsumeWhitespace("Unknown/Reserved", "n/a");
      if (!LookingAt("{") && !LookingAt("<")) {
        DO(SkipFieldValue());
      } else {
        DO(SkipFieldMessage());
      }
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }